

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskFilesystem>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::DiskFilesystem> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    Array<kj::String>::~Array((Array<kj::String> *)((long)pointer + 0x28));
    OwnFd::~OwnFd((OwnFd *)((long)pointer + 0x20));
    OwnFd::~OwnFd((OwnFd *)((long)pointer + 0x10));
  }
  operator_delete(pointer,0x40);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }